

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

llama_pos __thiscall
llama_kv_cache_unified::seq_pos_max(llama_kv_cache_unified *this,llama_seq_id seq_id)

{
  pointer plVar1;
  int iVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  if ((ulong)this->size != 0) {
    plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar3 = 0;
    iVar2 = 0;
    do {
      p_Var4 = *(_Base_ptr *)((long)&plVar1[uVar3].seq_id._M_t._M_impl + 0x10);
      if (p_Var4 != (_Base_ptr)0x0) {
        p_Var6 = (_Base_ptr)((long)&plVar1[uVar3].seq_id._M_t._M_impl + 8);
        p_Var5 = p_Var6;
        do {
          if (seq_id <= (int)p_Var4[1]._M_color) {
            p_Var5 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < seq_id];
        } while (p_Var4 != (_Base_ptr)0x0);
        if ((p_Var5 != p_Var6) && ((int)p_Var5[1]._M_color <= seq_id)) {
          if (iVar2 <= plVar1[uVar3].pos) {
            iVar2 = plVar1[uVar3].pos;
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != this->size);
    return iVar2;
  }
  return 0;
}

Assistant:

llama_pos llama_kv_cache_unified::seq_pos_max(llama_seq_id seq_id) const {
    llama_pos result = 0;

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id)) {
            result = std::max(result, cells[i].pos);
        }
    }

    return result;
}